

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom,REF_INT geom,REF_DBL *delta_radian)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double local_80;
  REF_INT local_74;
  double local_70;
  REF_INT local_68;
  int local_64;
  REF_BOOL use_face;
  REF_BOOL turn_off;
  REF_DBL face_active;
  REF_DBL face_set;
  REF_DBL face_segments;
  REF_DBL segments;
  REF_INT face;
  REF_INT face_geom;
  REF_INT item;
  REF_INT node;
  REF_DBL *delta_radian_local;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  bVar3 = false;
  bVar2 = false;
  face_segments = 0.0;
  if (ref_geom->face_seg_per_rad != (REF_DBL *)0x0) {
    iVar1 = ref_geom->descr[geom * 6 + 5];
    if ((iVar1 < 0) || (ref_geom->ref_adj->nnode <= iVar1)) {
      local_64 = -1;
    }
    else {
      local_64 = ref_geom->ref_adj->first[iVar1];
    }
    face = local_64;
    if (local_64 == -1) {
      local_68 = -1;
    }
    else {
      local_68 = ref_geom->ref_adj->item[local_64].ref;
    }
    segments._4_4_ = local_68;
    while (face != -1) {
      if ((ref_geom->descr[segments._4_4_ * 6] == 2) &&
         (local_70 = ref_geom->face_seg_per_rad[ref_geom->descr[segments._4_4_ * 6 + 1] + -1],
         -998.0 <= local_70)) {
        if (local_70 <= 0.01) {
          bVar2 = true;
          break;
        }
        if (local_70 < face_segments) {
          local_70 = face_segments;
        }
        face_segments = local_70;
        bVar3 = true;
      }
      face = ref_geom->ref_adj->item[face].next;
      if (face == -1) {
        local_74 = -1;
      }
      else {
        local_74 = ref_geom->ref_adj->item[face].ref;
      }
      segments._4_4_ = local_74;
    }
  }
  if (bVar2) {
    *delta_radian = 100.0;
  }
  else {
    if (!bVar3) {
      face_segments = ref_geom->segments_per_radian_of_curvature;
    }
    if (0.1 < face_segments) {
      if (face_segments * 1e+20 <= 0.0) {
        local_80 = -(face_segments * 1e+20);
      }
      else {
        local_80 = face_segments * 1e+20;
      }
      if (1.0 < local_80) {
        *delta_radian = 1.0 / face_segments;
        return 0;
      }
    }
    *delta_radian = 100.0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom, REF_INT geom,
                                           REF_DBL *delta_radian) {
  REF_INT node, item, face_geom, face;
  REF_DBL segments, face_segments;
  REF_DBL face_set = -998.0;
  REF_DBL face_active = 0.01;
  REF_BOOL turn_off, use_face;
  use_face = REF_FALSE;
  turn_off = REF_FALSE;

  segments = 0.0;

  if (NULL != (ref_geom)->face_seg_per_rad) {
    node = ref_geom_node(ref_geom, geom);
    each_ref_geom_having_node(ref_geom, node, item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        face = ref_geom_id(ref_geom, face_geom) - 1;
        face_segments = ref_geom->face_seg_per_rad[face];
        if (face_segments < face_set) continue;
        if (face_segments > face_active) {
          segments = MAX(segments, face_segments);
          use_face = REF_TRUE;
        } else {
          turn_off = REF_TRUE;
          break;
        }
      }
    }
  }

  if (turn_off) {
    *delta_radian = 100.0;
    return REF_SUCCESS;
  }

  if (!use_face) {
    segments = ref_geom_segments_per_radian_of_curvature(ref_geom);
  }

  if (segments > 0.1 && ref_math_divisible(1.0, segments)) {
    *delta_radian = 1.0 / segments;
  } else {
    *delta_radian = 100.0;
  }

  return REF_SUCCESS;
}